

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O3

MatrixXd *
fd::unflatten(MatrixXd *__return_storage_ptr__,
             Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *x,int dim
             )

{
  ulong uVar1;
  PointerType pdVar2;
  double *pdVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined8 *puVar7;
  long cols;
  ulong uVar8;
  
  cols = (long)dim;
  lVar6 = (x->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value / cols;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if ((dim != 0 && lVar6 != 0) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816(cols),0) < lVar6)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,x,SUB168(auVar5 % SEXT816(cols),0));
    *puVar7 = time;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,lVar6 * cols,lVar6,cols);
  uVar1 = (x->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (0 < (long)uVar1) {
    pdVar2 = (x->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_data;
    pdVar3 = (__return_storage_ptr__->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar6 = (__return_storage_ptr__->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    uVar8 = 0;
    do {
      uVar4 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      pdVar3[((long)uVar4 % (long)dim & 0xffffffffU) * lVar6 + (long)(int)((long)uVar4 / (long)dim)]
           = pdVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd unflatten(const Eigen::Ref<const Eigen::VectorXd>& x, int dim)
{
    assert(x.size() % dim == 0);
    Eigen::MatrixXd X(x.size() / dim, dim);
    for (int i = 0; i < x.size(); i++) {
        X(i / dim, i % dim) = x(i);
    }
    return X;
}